

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O1

void Gia_ManMultiReport(Aig_Man_t *p,char *pStr,int nTotalPo,int nTotalSize,abctime clkStart)

{
  int iVar1;
  int level;
  long lVar2;
  timespec ts;
  timespec local_38;
  
  printf("%3s : ");
  printf("PI =%6d  ",(ulong)(uint)p->nTruePis);
  printf("PO =%6d  ",(ulong)(uint)p->nTruePos);
  printf("FF =%7d  ",(ulong)(uint)p->nRegs);
  printf("ND =%7d  ",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
  iVar1 = nTotalPo;
  if (nTotalPo < 2) {
    iVar1 = 1;
  }
  printf("Solved =%7d (%5.1f %%)  ",((double)(nTotalPo - p->nTruePos) * 100.0) / (double)iVar1);
  iVar1 = 1;
  if (1 < nTotalSize) {
    iVar1 = nTotalSize;
  }
  printf("Size   =%7d (%5.1f %%)  ",
         ((double)(p->vObjs->nSize - p->nDeleted) * 100.0) / (double)iVar1);
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar2 - clkStart) / 1000000.0);
  return;
}

Assistant:

void Gia_ManMultiReport( Aig_Man_t * p, char * pStr, int nTotalPo, int nTotalSize, abctime clkStart )
{
    printf( "%3s : ", pStr );
    printf( "PI =%6d  ", Saig_ManPiNum(p) );
    printf( "PO =%6d  ", Saig_ManPoNum(p) );
    printf( "FF =%7d  ", Saig_ManRegNum(p) );
    printf( "ND =%7d  ", Aig_ManNodeNum(p) );
    printf( "Solved =%7d (%5.1f %%)  ", nTotalPo-Saig_ManPoNum(p), 100.0*(nTotalPo-Saig_ManPoNum(p))/Abc_MaxInt(1, nTotalPo) );
    printf( "Size   =%7d (%5.1f %%)  ", Aig_ManObjNum(p),          100.0*Aig_ManObjNum(p)/Abc_MaxInt(1, nTotalSize) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
}